

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_gg_palette_file(Config config,char *filename,Image *input_image)

{
  ostream *poVar1;
  char local_22f [5];
  ushort local_22a;
  undefined1 uStack_228;
  char buf [5];
  uint16_t c;
  int i;
  ostream local_218 [8];
  ofstream out;
  Image *input_image_local;
  char *filename_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open((char *)local_218,(_Ios_Openmode)filename);
  if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
    std::operator<<(local_218,".dw");
  }
  for (_uStack_228 = 0; _uStack_228 < 0x10; _uStack_228 = _uStack_228 + 1) {
    local_22a = (ushort)((int)(uint)input_image->palette[_uStack_228].red >> 4) |
                (ushort)(((int)(uint)input_image->palette[_uStack_228].green >> 4) << 4) |
                (ushort)(((int)(uint)input_image->palette[_uStack_228].blue >> 4) << 8);
    if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
      sprintf(local_22f,"%04X",(ulong)local_22a);
      poVar1 = std::operator<<(local_218," $");
      std::operator<<(poVar1,local_22f);
    }
    else {
      std::ostream::write((char *)local_218,(long)&local_22a);
    }
  }
  if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
    std::operator<<(local_218,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void write_gg_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".dw";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint16_t c = ((uint16_t) input_image->palette[i].red >> 4)
                   | (uint16_t) (input_image->palette[i].green >> 4) << 4
                   | (uint16_t) (input_image->palette[i].blue >> 4) << 8;

        if (!config.output_bin) {
            char buf[5];
            sprintf(buf, "%04X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 2);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}